

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtest.cpp
# Opt level: O1

bool __thiscall hashtest::DoLruHashTest(hashtest *this,char **hash_input,size_t nb_input)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  hashTestKey *phVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  char **ppcVar9;
  bool stored;
  LruHash<hashTestKey> hashTable;
  hashTestKey key;
  bool local_a1;
  char **local_a0;
  LruHash<hashTestKey> local_98;
  hashTestKey local_70;
  
  local_98.binHash.tableSize = 0;
  local_98.binHash.tableCount = 0;
  local_98.binHash.hashBin = (hashTestKey **)0x0;
  local_98.MostRecentlyUsed = (hashTestKey *)0x0;
  local_98.LeastRecentlyUsed = (hashTestKey *)0x0;
  local_98.targetSize = 0;
  local_a0 = hash_input;
  if (nb_input == 0) {
    bVar7 = true;
  }
  else {
    uVar8 = 0;
    bVar2 = true;
    do {
      pcVar1 = local_a0[uVar8];
      sVar4 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      if (0xf < sVar4) {
        sVar4 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      local_70.indx = uVar8;
      memcpy(local_70.text,pcVar1,sVar4);
      local_70.text_len = (uint32_t)sVar4;
      this = (hashtest *)&local_98;
      phVar5 = LruHash<hashTestKey>::InsertOrAdd
                         ((LruHash<hashTestKey> *)this,&local_70,true,&local_a1);
      if (uVar8 == 0x41) {
        bVar2 = LruCheck(this,&local_98);
      }
      if ((local_a1 & 1U) == 0) {
        bVar2 = false;
      }
      bVar7 = false;
      if (phVar5 != (hashTestKey *)0x0) {
        bVar7 = bVar2;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar8 < nb_input) && (bVar2 = bVar7, bVar7 != false));
  }
  bVar2 = false;
  if ((ulong)local_98.binHash._0_8_ >> 0x20 == nb_input) {
    bVar2 = bVar7;
  }
  if (bVar7 == false) {
    bVar2 = bVar7;
  }
  if (bVar2 != false) {
    bVar2 = LruCheck(this,&local_98);
  }
  if ((nb_input != 0) && (bVar2 != false)) {
    uVar8 = 0;
    do {
      pcVar1 = local_a0[uVar8];
      sVar4 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      if (0xf < sVar4) {
        sVar4 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      local_70.indx = uVar8;
      memcpy(local_70.text,pcVar1,sVar4);
      local_70.text_len = (uint32_t)sVar4;
      this = (hashtest *)&local_98;
      phVar5 = LruHash<hashTestKey>::InsertOrAdd
                         ((LruHash<hashTestKey> *)this,&local_70,true,&local_a1);
      bVar7 = false;
      if (((phVar5 != (hashTestKey *)0x0) && (local_a1 == false)) && (phVar5->count == 2)) {
        bVar7 = bVar2;
      }
      bVar2 = bVar7;
      uVar8 = uVar8 + 1;
    } while ((uVar8 < nb_input) && (bVar2 != false));
  }
  if (bVar2 != false) {
    bVar2 = LruCheck(this,&local_98);
  }
  if ((nb_input != 0) && (bVar2 != false)) {
    uVar8 = 0;
    do {
      pcVar1 = local_a0[uVar8];
      sVar4 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      if (0xf < sVar4) {
        sVar4 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      local_70.indx = uVar8;
      memcpy(local_70.text,pcVar1,sVar4);
      local_70.text_len = (uint32_t)sVar4;
      this = (hashtest *)&local_98;
      phVar5 = LruHash<hashTestKey>::Retrieve((LruHash<hashTestKey> *)this,&local_70);
      if ((phVar5 == (hashTestKey *)0x0) || (phVar5->text_len != local_70.text_len)) {
        bVar7 = false;
      }
      else {
        this = (hashtest *)phVar5->text;
        iVar3 = bcmp(this,local_70.text,(ulong)local_70.text_len);
        bVar7 = false;
        if ((iVar3 == 0) && (phVar5->count == 2)) {
          bVar7 = bVar2;
        }
      }
      bVar2 = bVar7;
      uVar8 = uVar8 + 1;
    } while ((uVar8 < nb_input) && (bVar2 != false));
  }
  if (bVar2 != false) {
    bVar2 = LruCheck(this,&local_98);
  }
  if (bVar2 != false) {
    ppcVar9 = to_not_hash;
    uVar8 = 0;
    do {
      pcVar1 = *ppcVar9;
      sVar4 = strlen(pcVar1);
      local_70.count = 1;
      local_70.hash = 0;
      local_70.indx = 0xff;
      if (0xf < sVar4) {
        sVar4 = 0x10;
      }
      local_70.HashNext = (hashTestKey *)0x0;
      local_70.LessRecentKey = (hashTestKey *)0x0;
      local_70.MoreRecentKey = (hashTestKey *)0x0;
      memcpy(local_70.text,pcVar1,sVar4);
      local_70.text_len = (uint32_t)sVar4;
      this = (hashtest *)&local_98;
      phVar5 = LruHash<hashTestKey>::Retrieve((LruHash<hashTestKey> *)this,&local_70);
      if (phVar5 != (hashTestKey *)0x0) {
        bVar2 = false;
      }
      if (5 < uVar8) break;
      uVar8 = uVar8 + 1;
      ppcVar9 = ppcVar9 + 1;
    } while (bVar2 != false);
  }
  if (bVar2 != false) {
    bVar2 = LruCheck(this,&local_98);
  }
  if (bVar2 != false) {
    pcVar1 = local_a0[nb_input >> 1];
    sVar6 = strlen(pcVar1);
    sVar4 = 0x10;
    if (sVar6 < 0x10) {
      sVar4 = sVar6;
    }
    local_70.count = 1;
    local_70.hash = 0;
    local_70.HashNext = (hashTestKey *)0x0;
    local_70.LessRecentKey = (hashTestKey *)0x0;
    local_70.MoreRecentKey = (hashTestKey *)0x0;
    local_70.indx = nb_input >> 1;
    memcpy(local_70.text,pcVar1,sVar4);
    local_70.text_len = (uint32_t)sVar4;
    phVar5 = LruHash<hashTestKey>::Remove(&local_98,&local_70);
    if (phVar5 != (hashTestKey *)0x0) {
      operator_delete(phVar5);
      nb_input = nb_input - 1;
      if (nb_input == (ulong)local_98.binHash._0_8_ >> 0x20) {
        bVar2 = LruCheck((hashtest *)phVar5,&local_98);
        goto LAB_0017d7d4;
      }
    }
    bVar2 = false;
  }
LAB_0017d7d4:
  if ((bVar2 != false) && (local_98.binHash.tableCount != 0)) {
    do {
      nb_input = nb_input - 1;
      phVar5 = LruHash<hashTestKey>::Remove(&local_98,local_98.LeastRecentlyUsed);
      if ((phVar5 == (hashTestKey *)0x0) ||
         (operator_delete(phVar5), nb_input != (ulong)local_98.binHash._0_8_ >> 0x20)) {
        bVar2 = false;
      }
      else {
        bVar2 = LruCheck((hashtest *)phVar5,&local_98);
      }
    } while ((bVar2 != false) && (local_98.binHash.tableCount != 0));
  }
  BinHash<hashTestKey>::Clear(&local_98.binHash);
  local_98.MostRecentlyUsed = (hashTestKey *)0x0;
  local_98.LeastRecentlyUsed = (hashTestKey *)0x0;
  BinHash<hashTestKey>::Clear(&local_98.binHash);
  return bVar2;
}

Assistant:

bool hashtest::DoLruHashTest(char const ** hash_input, size_t nb_input)
{
    LruHash<hashTestKey> hashTable;
    size_t target_size = nb_input;
    bool ret = true;

    /* Enter all the data in the input table */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (i == 0x41)
        {
            ret = LruCheck((void*)&hashTable);
        }

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!stored)
        {
            ret = false;
        }
    }

    if (ret && hashTable.GetCount() != target_size)
    {
        ret = false;
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be rewritten without creating new entries */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (stored)
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be retrieved */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!key.IsSameKey(retKey))
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the non-data cannot be retrieved */
    for (size_t i = 0; ret && i < size_to_not_hash; i++)
    {
        hashTestKey key((uint8_t const *)to_not_hash[i], strlen(to_not_hash[i]), 0xFF);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey != NULL)
        {
            ret = false;
        }
    }

    /* Check that the LRU Hash order is correct -- should be same as table order */

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Delete some random object, then check the table */
    if (ret)
    {
        size_t i = nb_input / 2;
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        hashTestKey * retKey = hashTable.Remove(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;
            target_size--;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }     
        }
    }

    /* Delete the LRU object, then check the table */
    while (ret && hashTable.GetCount() > 0)
    {
        hashTestKey * retKey = hashTable.RemoveLRU();
        target_size--;

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }
        }
    }
    return ret;
}